

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_spell_expr(parser *p)

{
  int16_t iVar1;
  int iVar2;
  void *pvVar3;
  expression_t *expression_00;
  char *name_00;
  char *name_01;
  char *string;
  expression_base_value_f function_00;
  char *expr;
  char *base;
  char *name;
  expression_base_value_f function;
  expression_t *expression;
  effect *effect;
  monster_spell *s;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    expression = *(expression_t **)((long)pvVar3 + 0x18);
    if (expression == (expression_t *)0x0) {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      for (; expression->base_value != (expression_base_value_f)0x0;
          expression = (expression_t *)expression->base_value) {
      }
      if (expression->operations_size == 0) {
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      else {
        expression_00 = expression_new();
        if (expression_00 == (expression_t *)0x0) {
          p_local._4_4_ = PARSE_ERROR_INVALID_EXPRESSION;
        }
        else {
          name_00 = parser_getsym(p,"name");
          name_01 = parser_getsym(p,"base");
          string = parser_getstr(p,"expr");
          function_00 = effect_value_base_by_name(name_01);
          expression_set_base_value(expression_00,function_00);
          iVar1 = expression_add_operations_string(expression_00,string);
          if (iVar1 < 0) {
            expression_free(expression_00);
            p_local._4_4_ = PARSE_ERROR_BAD_EXPRESSION_STRING;
          }
          else {
            iVar2 = dice_bind_expression
                              ((dice_t *)expression->operations_size,name_00,expression_00);
            if (iVar2 < 0) {
              expression_free(expression_00);
              p_local._4_4_ = PARSE_ERROR_UNBOUND_EXPRESSION;
            }
            else {
              expression_free(expression_00);
              p_local._4_4_ = PARSE_ERROR_NONE;
            }
          }
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_spell_expr(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct effect *effect;
	expression_t *expression;
	expression_base_value_f function = NULL;
	const char *name;
	const char *base;
	const char *expr;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	/* If there is no effect, assume that this is human and not parser error. */
	effect = s->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	/* If there are no dice, assume that this is human and not parser error. */
	if (effect->dice == NULL) {
		return PARSE_ERROR_NONE;
	}

	expression = expression_new();
	if (expression == NULL) {
		return PARSE_ERROR_INVALID_EXPRESSION;
	}
	name = parser_getsym(p, "name");
	base = parser_getsym(p, "base");
	expr = parser_getstr(p, "expr");
	function = effect_value_base_by_name(base);
	expression_set_base_value(expression, function);
	if (expression_add_operations_string(expression, expr) < 0) {
		expression_free(expression);
		return PARSE_ERROR_BAD_EXPRESSION_STRING;
	}
	if (dice_bind_expression(effect->dice, name, expression) < 0) {
		expression_free(expression);
		return PARSE_ERROR_UNBOUND_EXPRESSION;
	}

	/* The dice object makes a deep copy of the expression, so we can free it */
	expression_free(expression);
	return PARSE_ERROR_NONE;
}